

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_QuicLegacyCodepointDisabled_Test::TestBody
          (QUICMethodTest_QuicLegacyCodepointDisabled_Test *this)

{
  bool bVar1;
  pointer psVar2;
  char *pcVar3;
  pointer psVar4;
  size_t in_RCX;
  char *in_R9;
  Span<const_unsigned_char> expected;
  Span<const_unsigned_char> expected_00;
  SSL *local_228;
  uchar *local_220;
  SSL *local_218;
  uchar *local_210;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1a0;
  Message local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_158;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_128;
  uint8_t kServerParams [3];
  uint8_t kClientParams [4];
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70 [3];
  Message local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  SSL_QUIC_METHOD quic_method;
  QUICMethodTest_QuicLegacyCodepointDisabled_Test *this_local;
  
  QUICMethodTest::DefaultQUICMethod
            ((SSL_QUIC_METHOD *)&gtest_ar_.message_,&this->super_QUICMethodTest);
  psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  local_4c = SSL_CTX_set_quic_method(psVar2,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_48,&local_4c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_48,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    in_RCX = 0x1fd8;
    testing::internal::AssertHelper::AssertHelper
              (local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1fd8,pcVar3);
    testing::internal::AssertHelper::operator=(local_70,&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_58);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_QUICMethodTest).server_ctx_);
    local_ac = SSL_CTX_set_quic_method(psVar2,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_a8,&local_ac,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_a8,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      in_RCX = 0x1fd9;
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1fd9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_b8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_f1 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_128,(internal *)local_f0,
                   (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        in_RCX = 0x1fdb;
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1fdb,pcVar3);
        testing::internal::AssertHelper::operator=(&local_108,&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        testing::Message::~Message(&local_100);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0x4030201;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._1_2_ = 0x605;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._3_1_ = 7;
        psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_QUICMethodTest).client_);
        SSL_set_quic_use_legacy_codepoint(psVar4,0);
        psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_QUICMethodTest).server_);
        SSL_set_quic_use_legacy_codepoint(psVar4,0);
        psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_QUICMethodTest).client_);
        local_144 = SSL_set_quic_transport_params
                              (psVar4,(uint8_t *)
                                      ((long)&gtest_ar__3.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      + 4),4);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_140,&local_144,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
        if (!bVar1) {
          testing::Message::Message(&local_150);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_140,
                     (AssertionResult *)
                     "SSL_set_quic_transport_params(client_.get(), kClientParams, sizeof(kClientParams))"
                     ,"false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          in_RCX = 0x1fe1;
          testing::internal::AssertHelper::AssertHelper
                    (&local_158,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1fe1,pcVar3);
          testing::internal::AssertHelper::operator=(&local_158,&local_150);
          testing::internal::AssertHelper::~AssertHelper(&local_158);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_150);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_QUICMethodTest).server_);
          local_18c = SSL_set_quic_transport_params
                                (psVar4,(uint8_t *)
                                        ((long)&gtest_ar__3.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        + 1),3);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_188,&local_18c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
          if (!bVar1) {
            testing::Message::Message(&local_198);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_188,
                       (AssertionResult *)
                       "SSL_set_quic_transport_params(server_.get(), kServerParams, sizeof(kServerParams))"
                       ,"false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            in_RCX = 0x1fe3;
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1fe3,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
            testing::internal::AssertHelper::~AssertHelper(&local_1a0);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_198);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_1d1 = QUICMethodTest::CompleteHandshakesForQUIC(&this->super_QUICMethodTest);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
            if (!bVar1) {
              testing::Message::Message(&local_1e0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_208,(internal *)local_1d0,
                         (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              in_RCX = 0x1fe5;
              testing::internal::AssertHelper::AssertHelper
                        (&local_1e8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1fe5,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
              testing::internal::AssertHelper::~AssertHelper(&local_1e8);
              std::__cxx11::string::~string((string *)&local_208);
              testing::Message::~Message(&local_1e0);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_QUICMethodTest).client_);
              Span<unsigned_char_const>::Span<3ul>
                        ((Span<unsigned_char_const> *)&local_218,
                         (uchar (*) [3])
                         ((long)&gtest_ar__3.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 1));
              expected.size_ = in_RCX;
              expected.data_ = local_210;
              ExpectReceivedTransportParamsEqual((anon_unknown_0 *)psVar4,local_218,expected);
              psVar4 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_QUICMethodTest).server_);
              Span<unsigned_char_const>::Span<4ul>
                        ((Span<unsigned_char_const> *)&local_228,
                         (uchar (*) [4])
                         ((long)&gtest_ar__3.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 4));
              expected_00.size_ = in_RCX;
              expected_00.data_ = local_220;
              ExpectReceivedTransportParamsEqual((anon_unknown_0 *)psVar4,local_228,expected_00);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, QuicLegacyCodepointDisabled) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  uint8_t kClientParams[] = {1, 2, 3, 4};
  uint8_t kServerParams[] = {5, 6, 7};
  SSL_set_quic_use_legacy_codepoint(client_.get(), 0);
  SSL_set_quic_use_legacy_codepoint(server_.get(), 0);
  ASSERT_TRUE(SSL_set_quic_transport_params(client_.get(), kClientParams,
                                            sizeof(kClientParams)));
  ASSERT_TRUE(SSL_set_quic_transport_params(server_.get(), kServerParams,
                                            sizeof(kServerParams)));

  ASSERT_TRUE(CompleteHandshakesForQUIC());
  ExpectReceivedTransportParamsEqual(client_.get(), kServerParams);
  ExpectReceivedTransportParamsEqual(server_.get(), kClientParams);
}